

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture3DFormatCase::init(Texture3DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dataType;
  int extraout_EAX;
  Texture3D *this_00;
  TextureFormatInfo spec;
  TextureFormatInfo local_60;
  
  dataType = this->m_dataType;
  this_00 = (Texture3D *)operator_new(0x70);
  if (dataType == 0) {
    glu::Texture3D::Texture3D
              (this_00,this->m_renderCtx,this->m_format,this->m_width,this->m_height,this->m_depth);
  }
  else {
    glu::Texture3D::Texture3D
              (this_00,this->m_renderCtx,this->m_format,dataType,this->m_width,this->m_height,
               this->m_depth);
  }
  this->m_texture = this_00;
  tcu::getTextureFormatInfo(&local_60,(TextureFormat *)&this_00->m_refTexture);
  tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_60.valueMin,&local_60.valueMax);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  this->m_curSlice = 0;
  return extraout_EAX;
}

Assistant:

void Texture3DFormatCase::init (void)
{
	m_texture = m_dataType != GL_NONE
			  ? new glu::Texture3D(m_renderCtx, m_format, m_dataType, m_width, m_height, m_depth)	// Implicit internal format.
			  : new glu::Texture3D(m_renderCtx, m_format, m_width, m_height, m_depth);				// Explicit internal format.

	tcu::TextureFormatInfo spec = tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);

	// Initialize state.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_curSlice = 0;
}